

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsStoreGeometryStages::Write<tcu::Vector<float,4>>
          (BasicAllFormatsStoreGeometryStages *this,GLenum internalformat,
          Vector<float,_4> *write_value,Vector<float,_4> *expected_value)

{
  CallLogWrapper *this_00;
  vec4 *v1;
  bool bVar1;
  GLuint program;
  GLint GVar2;
  ostream *poVar3;
  GLenum internalformat_00;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  GLenum e_03;
  Vector<float,_4> *v;
  Vector<float,_4> *v_00;
  char *pcVar4;
  GLuint i_1;
  int i;
  long lVar5;
  ulong uVar6;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  string local_2a0;
  string local_280;
  BasicAllFormatsStoreGeometryStages *local_260;
  GLuint texture [4];
  char *local_228 [4];
  char *local_208 [4];
  char *local_1e8 [4];
  ostringstream os;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  
  v1 = (vec4 *)(ulong)internalformat;
  local_260 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar3 = std::operator<<((ostream *)&os,"#version 420 core\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_280,v1,e);
  poVar3 = std::operator<<(poVar3,(string *)&local_280);
  pcVar4 = ") writeonly uniform ";
  poVar3 = std::operator<<(poVar3,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_2a0,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a0);
  pcVar4 = 
  "image2DArray g_image0;\nvoid main() {\n  ivec3 coord = ivec3(gl_VertexID, 0, 0);\n  imageStore(g_image0, coord, "
  ;
  poVar3 = std::operator<<(poVar3,
                           "image2DArray g_image0;\nvoid main() {\n  ivec3 coord = ivec3(gl_VertexID, 0, 0);\n  imageStore(g_image0, coord, "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&data,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)&data);
  poVar3 = std::operator<<(poVar3,"vec4");
  poVar3 = tcu::operator<<(poVar3,write_value);
  std::operator<<(poVar3,");\n}");
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar3 = std::operator<<(&os.super_basic_ostream<char,_std::char_traits<char>_>,
                           "#version 420 core\nlayout(vertices = 1) out;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_280,v1,e_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_280);
  pcVar4 = ") writeonly uniform ";
  poVar3 = std::operator<<(poVar3,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_2a0,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a0);
  pcVar4 = 
  "image2DArray g_image1;\nvoid main() {\n  gl_TessLevelInner[0] = 1;\n  gl_TessLevelInner[1] = 1;\n  gl_TessLevelOuter[0] = 1;\n  gl_TessLevelOuter[1] = 1;\n  gl_TessLevelOuter[2] = 1;\n  gl_TessLevelOuter[3] = 1;\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  imageStore(g_image1, coord, "
  ;
  poVar3 = std::operator<<(poVar3,
                           "image2DArray g_image1;\nvoid main() {\n  gl_TessLevelInner[0] = 1;\n  gl_TessLevelInner[1] = 1;\n  gl_TessLevelOuter[0] = 1;\n  gl_TessLevelOuter[1] = 1;\n  gl_TessLevelOuter[2] = 1;\n  gl_TessLevelOuter[3] = 1;\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  imageStore(g_image1, coord, "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&data,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)&data);
  poVar3 = std::operator<<(poVar3,"vec4");
  poVar3 = tcu::operator<<(poVar3,write_value);
  std::operator<<(poVar3,");\n}");
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar3 = std::operator<<(&os.super_basic_ostream<char,_std::char_traits<char>_>,
                           "#version 420 core\nlayout(triangles, point_mode) in;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_280,v1,e_01);
  poVar3 = std::operator<<(poVar3,(string *)&local_280);
  pcVar4 = ") writeonly uniform ";
  poVar3 = std::operator<<(poVar3,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_2a0,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a0);
  pcVar4 = 
  "image2DArray g_image2;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  imageStore(g_image2, coord, "
  ;
  poVar3 = std::operator<<(poVar3,
                           "image2DArray g_image2;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  imageStore(g_image2, coord, "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&data,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)&data);
  poVar3 = std::operator<<(poVar3,"vec4");
  poVar3 = tcu::operator<<(poVar3,write_value);
  std::operator<<(poVar3,");\n}");
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar3 = std::operator<<(&os.super_basic_ostream<char,_std::char_traits<char>_>,
                           "#version 420 core\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout("
                          );
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_280,v1,e_02);
  poVar3 = std::operator<<(poVar3,(string *)&local_280);
  pcVar4 = ") writeonly uniform ";
  poVar3 = std::operator<<(poVar3,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>(&local_2a0,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a0);
  pcVar4 = 
  "image2DArray g_image3;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveIDIn, 0, 0);\n  imageStore(g_image3, coord, "
  ;
  poVar3 = std::operator<<(poVar3,
                           "image2DArray g_image3;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveIDIn, 0, 0);\n  imageStore(g_image3, coord, "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>((string *)&data,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)&data);
  poVar3 = std::operator<<(poVar3,"vec4");
  poVar3 = tcu::operator<<(poVar3,write_value);
  std::operator<<(poVar3,");\n}");
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  program = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)local_260,(char *)texture._0_8_,local_1e8[0],
                       local_208[0],local_228[0],(char *)0x0,(bool *)0x0);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)texture);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,1,(allocator_type *)&os);
  this_00 = (CallLogWrapper *)(local_260 + 8);
  glu::CallLogWrapper::glGenTextures(this_00,4,texture);
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,texture[lVar5]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x8c1a,0,internalformat,1,1,1,0,0x1908,0x1406,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
  }
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image0");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,0);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image1");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,1);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image2");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,2);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image3");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,3);
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    glu::CallLogWrapper::glBindImageTexture
              (this_00,(GLuint)lVar5,texture[lVar5],0,'\x01',0,0x88b9,internalformat);
  }
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(local_260 + 0x28));
  glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,1);
  glu::CallLogWrapper::glDrawArrays(this_00,0xe,0,1);
  glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,3);
  uVar6 = 0;
  do {
    if (uVar6 == 4) {
      glu::CallLogWrapper::glDeleteTextures(this_00,4,texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
LAB_00a3513c:
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      return 3 < uVar6;
    }
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,texture[uVar6]);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    internalformat_00 = 0x1908;
    glu::CallLogWrapper::glGetTexImage
              (this_00,0x8c1a,0,0x1908,0x1406,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)
                       data.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,expected_value,v1,internalformat_00
                      );
    if (!bVar1) {
      glu::CallLogWrapper::glDeleteTextures(this_00,4,texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      tcu::Vector<float,_4>::Vector
                (&local_40,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>((string *)&os,&local_40,v);
      tcu::Vector<float,_4>::Vector(&local_50,expected_value);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>(&local_280,&local_50,v_00);
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2a0,v1,e_03);
      pcVar4 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                         ((ShaderImageLoadStoreBase *)(uVar6 & 0xffffffff),internalformat);
      gl4cts::anon_unknown_0::Output
                ("Value is: %s. Value should be: %s. Format is: %s. Stage is: %s.\n",
                 os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                 local_280._M_dataplus._M_p,local_2a0._M_dataplus._M_p,pcVar4);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&os);
      goto LAB_00a3513c;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const GLuint program =
			BuildProgram(GenVS(internalformat, write_value).c_str(), GenTCS(internalformat, write_value).c_str(),
						 GenTES(internalformat, write_value).c_str(), GenGS(internalformat, write_value).c_str(), NULL);
		const int	  kSize = 1;
		std::vector<T> data(kSize * kSize);
		GLuint		   texture[4];
		glGenTextures(4, texture);

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D_ARRAY, texture[i]);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, internalformat, kSize, kSize, 1, 0, Format<T>(), Type<T>(), &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image0"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image1"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image2"), 2);
		glUniform1i(glGetUniformLocation(program, "g_image3"), 3);
		for (GLuint i = 0; i < 4; ++i)
		{
			glBindImageTexture(i, texture[i], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		}
		glBindVertexArray(m_vao);
		glPatchParameteri(GL_PATCH_VERTICES, 1);
		glDrawArrays(GL_PATCHES, 0, 1);
		glPatchParameteri(GL_PATCH_VERTICES, 3);

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D_ARRAY, texture[i]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, Format<T>(), Type<T>(), &data[0]);

			if (!Equal(data[0], expected_value, internalformat))
			{
				glDeleteTextures(4, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Value is: %s. Value should be: %s. Format is: %s. Stage is: %s.\n", ToString(data[0]).c_str(),
					   ToString(expected_value).c_str(), FormatEnumToString(internalformat).c_str(), StageName(i));
				return false;
			}
		}
		glDeleteTextures(4, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		return true;
	}